

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O1

ssize_t __thiscall chatter::Packet::read(Packet *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer puVar1;
  uint64_t uVar2;
  undefined4 in_register_00000034;
  uint64_t local_18;
  
  uVar2 = this->m_read_pos;
  puVar1 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar2 + 8 <=
      (ulong)((long)(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
    local_18 = *(uint64_t *)(puVar1 + uVar2);
    uVar2 = platform::NetToHost64(&local_18);
    *(uint64_t *)CONCAT44(in_register_00000034,__fd) = uVar2;
    this->m_read_pos = this->m_read_pos + 8;
  }
  return uVar2;
}

Assistant:

void Packet::read(int64_t& data)
{
    if (!check_bounds(sizeof(data)))
        return;

    data = platform::NetToHost64(*reinterpret_cast<const int64_t*>(&m_data[m_read_pos]));
    m_read_pos += sizeof(data);
}